

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O0

exr_result_t
extract_chunk_table(_internal_exr_context *ctxt,_internal_exr_part *part,uint64_t **chunktable,
                   uint64_t *chunkminoffset)

{
  exr_result_t eVar1;
  int iVar2;
  uint64_t uVar3;
  _internal_exr_context *p_Var4;
  long *in_RCX;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  bool bVar5;
  uint64_t cchunk;
  int ci;
  exr_result_t rv;
  uint64_t maxoff;
  int complete;
  uintptr_t nptr;
  uintptr_t eptr;
  int64_t nread;
  uint64_t chunkbytes;
  uint64_t chunkoff;
  uint64_t *ctable;
  int local_78;
  ulong local_70;
  uint in_stack_ffffffffffffff98;
  int iVar6;
  _internal_exr_part *part_00;
  _internal_exr_context *ctxt_00;
  undefined8 local_50;
  _internal_exr_context *local_48;
  long local_40;
  ulong local_38;
  _internal_exr_context *local_30;
  long *local_20;
  long local_18;
  long local_10;
  
  local_38 = *(ulong *)(in_RSI + 0xf8);
  local_40 = (long)*(int *)(in_RSI + 0xf4) * 8;
  *in_RCX = local_38 + local_40;
  local_48 = *(_internal_exr_context **)(in_RSI + 0x100);
  local_30 = local_48;
  local_20 = in_RDX;
  if (local_48 == (_internal_exr_context *)0x0) {
    local_50 = 0;
    ctxt_00 = (_internal_exr_context *)0x0;
    part_00 = (_internal_exr_part *)0x0;
    iVar6 = 1;
    local_70 = 0xffffffffffffffff;
    local_30 = local_48;
    if (*(int *)(in_RSI + 0xf4) < 1) {
      eVar1 = (**(code **)(in_RDI + 0x40))(in_RDI,3,"Invalid file with no chunks");
      return eVar1;
    }
    if ((0 < *(long *)(in_RDI + 0x98)) && (*(ulong *)(in_RDI + 0x98) < local_40 + local_38)) {
      eVar1 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,3,"chunk table size (%lu) too big for file size (%ld)",local_40,
                         *(undefined8 *)(in_RDI + 0x98));
      return eVar1;
    }
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_30 = (_internal_exr_context *)(**(code **)(in_RDI + 0x58))(local_40);
    if (local_30 == (_internal_exr_context *)0x0) {
      eVar1 = (**(code **)(local_10 + 0x38))(local_10,1);
      return eVar1;
    }
    iVar2 = (**(code **)(local_10 + 0x28))(local_10,local_30,local_40,&local_38,&local_50,0);
    if (iVar2 != 0) {
      (**(code **)(local_10 + 0x60))(local_30);
      return iVar2;
    }
    if (*(char *)(local_10 + 0x1f8) == '\0') {
      if (0 < *(long *)(local_10 + 0x98)) {
        local_70 = *(ulong *)(local_10 + 0x98);
      }
      for (local_78 = 0; local_78 < *(int *)(local_18 + 0xf4); local_78 = local_78 + 1) {
        uVar3 = one_to_native64(0x147017);
        if ((uVar3 < local_38) || (local_70 <= uVar3)) {
          iVar6 = 0;
        }
        *(uint64_t *)(&local_30->mode + (long)local_78 * 8) = uVar3;
      }
      if (((iVar6 == 0) &&
          (eVar1 = reconstruct_chunk_table
                             (ctxt_00,part_00,(uint64_t *)(ulong)in_stack_ffffffffffffff98),
          eVar1 != 0)) && (*(char *)(local_10 + 6) != '\0')) {
        (**(code **)(local_10 + 0x60))(local_30);
        eVar1 = (**(code **)(local_10 + 0x40))
                          (local_10,0x16,"Incomplete / corrupt chunk table, unable to reconstruct");
        return eVar1;
      }
    }
    else {
      priv_to_native64(local_30,*(int *)(local_18 + 0xf4));
    }
    LOCK();
    p_Var4 = *(_internal_exr_context **)(local_18 + 0x100);
    bVar5 = ctxt_00 == p_Var4;
    if (bVar5) {
      *(_internal_exr_context **)(local_18 + 0x100) = local_30;
      p_Var4 = ctxt_00;
    }
    UNLOCK();
    if ((!bVar5) &&
       ((**(code **)(local_10 + 0x60))(local_30), local_30 = p_Var4,
       p_Var4 == (_internal_exr_context *)0x0)) {
      eVar1 = (**(code **)(local_10 + 0x38))(local_10,1);
      return eVar1;
    }
  }
  *local_20 = (long)local_30;
  return 0;
}

Assistant:

static exr_result_t
extract_chunk_table (
    const struct _internal_exr_context* ctxt,
    const struct _internal_exr_part*    part,
    uint64_t**                          chunktable,
    uint64_t*                           chunkminoffset)
{
    uint64_t* ctable     = NULL;
    uint64_t  chunkoff   = part->chunk_table_offset;
    uint64_t  chunkbytes = sizeof (uint64_t) * (uint64_t) part->chunk_count;

    *chunkminoffset = chunkoff + chunkbytes;

#if defined(_MSC_VER)
    ctable = (uint64_t*) InterlockedOr64 (
        (int64_t volatile*) &(part->chunk_table), 0);
#else
    ctable = (uint64_t*) atomic_load (
        EXR_CONST_CAST (atomic_uintptr_t*, &(part->chunk_table)));
#endif
    
    if (ctable == NULL)
    {
        int64_t      nread = 0;
        uintptr_t    eptr = 0, nptr = 0;
        int          complete = 1;
        uint64_t     maxoff   = ((uint64_t) -1);
        exr_result_t rv;

        if (part->chunk_count <= 0)
            return ctxt->report_error (
                ctxt, EXR_ERR_INVALID_ARGUMENT, "Invalid file with no chunks");

        if (ctxt->file_size > 0 &&
            chunkbytes + chunkoff > (uint64_t) ctxt->file_size)
            return ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "chunk table size (%" PRIu64 ") too big for file size (%" PRId64
                ")",
                chunkbytes,
                ctxt->file_size);

        ctable = (uint64_t*) ctxt->alloc_fn (chunkbytes);
        if (ctable == NULL)
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);

        rv = ctxt->do_read (
            ctxt, ctable, chunkbytes, &chunkoff, &nread, EXR_MUST_READ_ALL);
        if (rv != EXR_ERR_SUCCESS)
        {
            ctxt->free_fn (ctable);
            return rv;
        }

        if (!ctxt->disable_chunk_reconstruct)
        {
            // could convert table all at once, but need to check if the
            // file is incomplete (i.e. crashed during write and didn't
            // get a complete chunk table), so just do them one at a time
            if (ctxt->file_size > 0) maxoff = (uint64_t) ctxt->file_size;
            for (int ci = 0; ci < part->chunk_count; ++ci)
            {
                uint64_t cchunk = one_to_native64 (ctable[ci]);
                if (cchunk < chunkoff || cchunk >= maxoff) complete = 0;
                ctable[ci] = cchunk;
            }

            if (!complete)
            {
                // The c++ side would basically fail as soon as it
                // failed, but would otherwise swallow all errors, and
                // then just let the reads fail later. We will do
                // something similar, except when in strict mode, we
                // will fail with a corrupt chunk immediately.
                rv = reconstruct_chunk_table (ctxt, part, ctable);
                if (rv != EXR_ERR_SUCCESS && ctxt->strict_header)
                {
                    ctxt->free_fn (ctable);
                    return ctxt->report_error (
                        ctxt,
                        EXR_ERR_BAD_CHUNK_LEADER,
                        "Incomplete / corrupt chunk table, unable to reconstruct");
                }
            }
        }
        else { priv_to_native64 (ctable, part->chunk_count); }

        nptr = (uintptr_t) ctable;
        // see if we win or not
        if (!atomic_compare_exchange_strong (
                EXR_CONST_CAST (atomic_uintptr_t*, &(part->chunk_table)),
                &eptr,
                nptr))
        {
            ctxt->free_fn (ctable);
            ctable = (uint64_t*) eptr;
            if (ctable == NULL)
                return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        }
    }

    *chunktable = ctable;
    return EXR_ERR_SUCCESS;
}